

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::get_append
          (CImg<unsigned_char> *__return_storage_ptr__,CImgList<unsigned_char> *this,char axis,
          float align)

{
  uint uVar1;
  uint uVar2;
  CImg<unsigned_char> *pCVar3;
  char cVar4;
  long lVar5;
  CImg<unsigned_char> *pCVar6;
  uint uVar7;
  uint uVar8;
  CImgList<unsigned_char> *pCVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  int l;
  long lVar13;
  int l_2;
  uint uVar14;
  uchar local_48 [4];
  float local_44;
  CImgList<unsigned_char> *local_40;
  CImg<unsigned_char> *local_38;
  
  pCVar6 = this->_data;
  uVar8 = this->_width;
  local_38 = __return_storage_ptr__;
  if (uVar8 == 0 || pCVar6 == (CImg<unsigned_char> *)0x0) {
    __return_storage_ptr__->_data = (uchar *)0x0;
    __return_storage_ptr__->_width = 0;
    __return_storage_ptr__->_height = 0;
    __return_storage_ptr__->_depth = 0;
    __return_storage_ptr__->_spectrum = 0;
    __return_storage_ptr__->_is_shared = false;
  }
  else {
    uVar10 = (ulong)uVar8;
    local_44 = align;
    if (uVar8 == 1) {
      CImg<unsigned_char>::CImg(__return_storage_ptr__,pCVar6,false);
    }
    else {
      __return_storage_ptr__->_data = (uchar *)0x0;
      __return_storage_ptr__->_width = 0;
      __return_storage_ptr__->_height = 0;
      __return_storage_ptr__->_depth = 0;
      __return_storage_ptr__->_spectrum = 0;
      __return_storage_ptr__->_is_shared = false;
      cVar4 = axis + ' ';
      if ((byte)(axis + 0xa5U) < 0xe6) {
        cVar4 = axis;
      }
      local_40 = this;
      if (cVar4 == 'x') {
        if ((int)uVar8 < 1) {
          uVar7 = 0;
          uVar11 = 0;
          uVar8 = 0;
          uVar14 = 0;
        }
        else {
          lVar5 = 0;
          uVar14 = 0;
          uVar8 = 0;
          uVar11 = 0;
          uVar7 = 0;
          do {
            if (*(long *)((long)&pCVar6->_data + lVar5) != 0) {
              uVar7 = uVar7 + *(int *)((long)&pCVar6->_width + lVar5);
              uVar1 = *(uint *)((long)&pCVar6->_height + lVar5);
              uVar2 = *(uint *)((long)&pCVar6->_depth + lVar5);
              if (uVar11 <= uVar1) {
                uVar11 = uVar1;
              }
              if (uVar8 <= uVar2) {
                uVar8 = uVar2;
              }
              uVar1 = *(uint *)((long)&pCVar6->_spectrum + lVar5);
              if (uVar14 <= uVar1) {
                uVar14 = uVar1;
              }
            }
            lVar5 = lVar5 + 0x20;
          } while (uVar10 << 5 != lVar5);
        }
        local_48[3] = 0;
        pCVar6 = CImg<unsigned_char>::assign(__return_storage_ptr__,uVar7,uVar11,uVar8,uVar14);
        CImg<unsigned_char>::fill(pCVar6,local_48 + 3);
        if ((__return_storage_ptr__->_data != (uchar *)0x0) && (0 < (int)local_40->_width)) {
          lVar5 = 0;
          lVar13 = 0;
          iVar12 = 0;
          pCVar9 = local_40;
          do {
            pCVar3 = pCVar9->_data;
            pCVar6 = (CImg<unsigned_char> *)((long)&pCVar3->_width + lVar5);
            if (*(long *)((long)&pCVar3->_data + lVar5) != 0) {
              CImg<unsigned_char>::draw_image
                        (local_38,iVar12,
                         (int)((float)(uVar11 - *(int *)((long)&pCVar3->_height + lVar5)) * local_44
                              ),(int)((float)(uVar8 - *(int *)((long)&pCVar3->_depth + lVar5)) *
                                     local_44),
                         (int)((float)(uVar14 - *(int *)((long)&pCVar3->_spectrum + lVar5)) *
                              local_44),pCVar6,1.0);
              pCVar9 = local_40;
            }
            iVar12 = iVar12 + pCVar6->_width;
            lVar13 = lVar13 + 1;
            lVar5 = lVar5 + 0x20;
          } while (lVar13 < (int)pCVar9->_width);
        }
      }
      else if (cVar4 == 'y') {
        if ((int)uVar8 < 1) {
          uVar8 = 0;
          uVar7 = 0;
          uVar11 = 0;
          uVar14 = 0;
        }
        else {
          lVar5 = 0;
          uVar14 = 0;
          uVar11 = 0;
          uVar7 = 0;
          uVar8 = 0;
          do {
            if (*(long *)((long)&pCVar6->_data + lVar5) != 0) {
              uVar1 = *(uint *)((long)&pCVar6->_width + lVar5);
              if (uVar8 <= uVar1) {
                uVar8 = uVar1;
              }
              uVar1 = *(uint *)((long)&pCVar6->_depth + lVar5);
              uVar7 = uVar7 + *(int *)((long)&pCVar6->_height + lVar5);
              if (uVar11 <= uVar1) {
                uVar11 = uVar1;
              }
              uVar1 = *(uint *)((long)&pCVar6->_spectrum + lVar5);
              if (uVar14 <= uVar1) {
                uVar14 = uVar1;
              }
            }
            lVar5 = lVar5 + 0x20;
          } while (uVar10 << 5 != lVar5);
        }
        local_48[2] = 0;
        pCVar6 = CImg<unsigned_char>::assign(__return_storage_ptr__,uVar8,uVar7,uVar11,uVar14);
        CImg<unsigned_char>::fill(pCVar6,local_48 + 2);
        if ((__return_storage_ptr__->_data != (uchar *)0x0) && (0 < (int)local_40->_width)) {
          lVar5 = 0;
          lVar13 = 0;
          iVar12 = 0;
          pCVar9 = local_40;
          do {
            pCVar6 = pCVar9->_data;
            if (*(long *)((long)&pCVar6->_data + lVar5) != 0) {
              CImg<unsigned_char>::draw_image
                        (local_38,(int)((float)(uVar8 - *(int *)((long)&pCVar6->_width + lVar5)) *
                                       local_44),iVar12,
                         (int)((float)(uVar11 - *(int *)((long)&pCVar6->_depth + lVar5)) * local_44)
                         ,(int)((float)(uVar14 - *(int *)((long)&pCVar6->_spectrum + lVar5)) *
                               local_44),(CImg<unsigned_char> *)((long)&pCVar6->_width + lVar5),1.0)
              ;
              pCVar9 = local_40;
            }
            iVar12 = iVar12 + *(int *)((long)&pCVar6->_height + lVar5);
            lVar13 = lVar13 + 1;
            lVar5 = lVar5 + 0x20;
          } while (lVar13 < (int)pCVar9->_width);
        }
      }
      else if (cVar4 == 'z') {
        if ((int)uVar8 < 1) {
          uVar8 = 0;
          uVar11 = 0;
          uVar7 = 0;
          uVar14 = 0;
        }
        else {
          lVar5 = 0;
          uVar14 = 0;
          uVar7 = 0;
          uVar11 = 0;
          uVar8 = 0;
          do {
            if (*(long *)((long)&pCVar6->_data + lVar5) != 0) {
              uVar1 = *(uint *)((long)&pCVar6->_width + lVar5);
              uVar2 = *(uint *)((long)&pCVar6->_height + lVar5);
              if (uVar8 <= uVar1) {
                uVar8 = uVar1;
              }
              if (uVar11 <= uVar2) {
                uVar11 = uVar2;
              }
              uVar7 = uVar7 + *(int *)((long)&pCVar6->_depth + lVar5);
              uVar1 = *(uint *)((long)&pCVar6->_spectrum + lVar5);
              if (uVar14 <= uVar1) {
                uVar14 = uVar1;
              }
            }
            lVar5 = lVar5 + 0x20;
          } while (uVar10 << 5 != lVar5);
        }
        local_48[1] = 0;
        pCVar6 = CImg<unsigned_char>::assign(__return_storage_ptr__,uVar8,uVar11,uVar7,uVar14);
        CImg<unsigned_char>::fill(pCVar6,local_48 + 1);
        if ((__return_storage_ptr__->_data != (uchar *)0x0) && (0 < (int)local_40->_width)) {
          lVar5 = 0;
          lVar13 = 0;
          iVar12 = 0;
          pCVar9 = local_40;
          do {
            pCVar6 = pCVar9->_data;
            if (*(long *)((long)&pCVar6->_data + lVar5) != 0) {
              CImg<unsigned_char>::draw_image
                        (local_38,(int)((float)(uVar8 - *(int *)((long)&pCVar6->_width + lVar5)) *
                                       local_44),
                         (int)((float)(uVar11 - *(int *)((long)&pCVar6->_height + lVar5)) * local_44
                              ),iVar12,
                         (int)((float)(uVar14 - *(int *)((long)&pCVar6->_spectrum + lVar5)) *
                              local_44),(CImg<unsigned_char> *)((long)&pCVar6->_width + lVar5),1.0);
              pCVar9 = local_40;
            }
            iVar12 = iVar12 + *(int *)((long)&pCVar6->_depth + lVar5);
            lVar13 = lVar13 + 1;
            lVar5 = lVar5 + 0x20;
          } while (lVar13 < (int)pCVar9->_width);
        }
      }
      else {
        if ((int)uVar8 < 1) {
          uVar8 = 0;
          uVar11 = 0;
          uVar14 = 0;
          uVar7 = 0;
        }
        else {
          lVar5 = 0;
          uVar7 = 0;
          uVar14 = 0;
          uVar11 = 0;
          uVar8 = 0;
          do {
            if (*(long *)((long)&pCVar6->_data + lVar5) != 0) {
              uVar1 = *(uint *)((long)&pCVar6->_width + lVar5);
              uVar2 = *(uint *)((long)&pCVar6->_height + lVar5);
              if (uVar8 <= uVar1) {
                uVar8 = uVar1;
              }
              if (uVar11 <= uVar2) {
                uVar11 = uVar2;
              }
              uVar1 = *(uint *)((long)&pCVar6->_depth + lVar5);
              if (uVar14 <= uVar1) {
                uVar14 = uVar1;
              }
              uVar7 = uVar7 + *(int *)((long)&pCVar6->_spectrum + lVar5);
            }
            lVar5 = lVar5 + 0x20;
          } while (uVar10 << 5 != lVar5);
        }
        local_48[0] = '\0';
        pCVar6 = CImg<unsigned_char>::assign(__return_storage_ptr__,uVar8,uVar11,uVar14,uVar7);
        CImg<unsigned_char>::fill(pCVar6,local_48);
        if ((__return_storage_ptr__->_data != (uchar *)0x0) && (0 < (int)local_40->_width)) {
          lVar5 = 0;
          lVar13 = 0;
          iVar12 = 0;
          pCVar9 = local_40;
          do {
            pCVar6 = pCVar9->_data;
            if (*(long *)((long)&pCVar6->_data + lVar5) != 0) {
              CImg<unsigned_char>::draw_image
                        (local_38,(int)((float)(uVar8 - *(int *)((long)&pCVar6->_width + lVar5)) *
                                       local_44),
                         (int)((float)(uVar11 - *(int *)((long)&pCVar6->_height + lVar5)) * local_44
                              ),(int)((float)(uVar14 - *(int *)((long)&pCVar6->_depth + lVar5)) *
                                     local_44),iVar12,
                         (CImg<unsigned_char> *)((long)&pCVar6->_width + lVar5),1.0);
              pCVar9 = local_40;
            }
            iVar12 = iVar12 + *(int *)((long)&pCVar6->_spectrum + lVar5);
            lVar13 = lVar13 + 1;
            lVar5 = lVar5 + 0x20;
          } while (lVar13 < (int)pCVar9->_width);
        }
      }
    }
  }
  return local_38;
}

Assistant:

CImg<T> get_append(const char axis, const float align=0) const {
      if (is_empty()) return CImg<T>();
      if (_width==1) return +((*this)[0]);
      unsigned int dx = 0, dy = 0, dz = 0, dc = 0, pos = 0;
      CImg<T> res;
      switch (cimg::uncase(axis)) {
      case 'x' : { // Along the X-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx+=img._width;
            dy = cimg::max(dy,img._height);
            dz = cimg::max(dz,img._depth);
            dc = cimg::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) res.draw_image(pos,
                                    (int)(align*(dy - img._height)),
                                    (int)(align*(dz - img._depth)),
                                    (int)(align*(dc - img._spectrum)),
                                    img);
            pos+=img._width;
          }
      } break;
      case 'y' : { // Along the Y-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = cimg::max(dx,img._width);
            dy+=img._height;
            dz = cimg::max(dz,img._depth);
            dc = cimg::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) res.draw_image((int)(align*(dx - img._width)),
                                    pos,
                                    (int)(align*(dz - img._depth)),
                                    (int)(align*(dc - img._spectrum)),
                                    img);
            pos+=img._height;
          }
      } break;
      case 'z' : { // Along the Z-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = cimg::max(dx,img._width);
            dy = cimg::max(dy,img._height);
            dz+=img._depth;
            dc = cimg::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) res.draw_image((int)(align*(dx - img._width)),
                                    (int)(align*(dy - img._height)),
                                    pos,
                                    (int)(align*(dc - img._spectrum)),
                                    img);
            pos+=img._depth;
          }
      } break;
      default : { // Along the C-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = cimg::max(dx,img._width);
            dy = cimg::max(dy,img._height);
            dz = cimg::max(dz,img._depth);
            dc+=img._spectrum;
          }
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) res.draw_image((int)(align*(dx - img._width)),
                                    (int)(align*(dy - img._height)),
                                    (int)(align*(dz - img._depth)),
                                    pos,
                                    img);
            pos+=img._spectrum;
          }
      }
      }
      return res;
    }